

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall
wallet::CWallet::ImportScripts
          (CWallet *this,set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *scripts,
          int64_t timestamp)

{
  long lVar1;
  LegacyScriptPubKeyMan *mutexIn;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDX;
  CWallet *in_RSI;
  long in_FS_OFFSET;
  LegacyScriptPubKeyMan *spk_man;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock37;
  set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  undefined1 local_49;
  int64_t in_stack_ffffffffffffffc0;
  set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *in_stack_ffffffffffffffc8;
  LegacyScriptPubKeyMan *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mutexIn = GetLegacyScriptPubKeyMan(in_RSI);
  if (mutexIn == (LegacyScriptPubKeyMan *)0x0) {
    local_49 = false;
  }
  else {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff58);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (in_RDX,(AnnotatedMixin<std::recursive_mutex> *)mutexIn,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,(int)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0)
              );
    std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::set
              (in_stack_ffffffffffffff58,
               (set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)0x1b08ff);
    local_49 = LegacyScriptPubKeyMan::ImportScripts
                         (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                          in_stack_ffffffffffffffc0);
    std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::~set(in_stack_ffffffffffffff58)
    ;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::ImportScripts(const std::set<CScript> scripts, int64_t timestamp)
{
    auto spk_man = GetLegacyScriptPubKeyMan();
    if (!spk_man) {
        return false;
    }
    LOCK(spk_man->cs_KeyStore);
    return spk_man->ImportScripts(scripts, timestamp);
}